

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSH * curl_share_init(void)

{
  Curl_easy *pCVar1;
  Curl_share *share;
  
  share = (Curl_share *)(*Curl_ccalloc)(1,0x100);
  if (share != (Curl_share *)0x0) {
    share->magic = 0x7e117a1e;
    share->specifier = share->specifier | 2;
    Curl_dnscache_init(&share->dnscache,0x17);
    pCVar1 = (Curl_easy *)curl_easy_init();
    share->admin = pCVar1;
    if (share->admin == (Curl_easy *)0x0) {
      (*Curl_cfree)(share);
      share = (Curl_share *)0x0;
    }
    else {
      share->admin->mid = 0;
      *(uint *)&(share->admin->state).field_0x7be =
           *(uint *)&(share->admin->state).field_0x7be & 0xffefffff | 0x100000;
    }
  }
  return share;
}

Assistant:

CURLSH *
curl_share_init(void)
{
  struct Curl_share *share = calloc(1, sizeof(struct Curl_share));
  if(share) {
    share->magic = CURL_GOOD_SHARE;
    share->specifier |= (1 << CURL_LOCK_DATA_SHARE);
    Curl_dnscache_init(&share->dnscache, 23);
    share->admin = curl_easy_init();
    if(!share->admin) {
      free(share);
      return NULL;
    }
    /* admin handles have mid 0 */
    share->admin->mid = 0;
    share->admin->state.internal = TRUE;
#ifdef DEBUGBUILD
    if(getenv("CURL_DEBUG"))
      share->admin->set.verbose = TRUE;
#endif
  }

  return share;
}